

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::FGetsFunc::FGetsFunc(FGetsFunc *this)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__FGetsFunc_00ff4e90;
  *(undefined1 *)(in_RDI + 6) = 1;
  return;
}

Assistant:

FGetsFunc() : SystemSubroutine(KnownSystemName::FGets, SubroutineKind::Function) {
        hasOutputArgs = true;
    }